

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# openssl.c
# Opt level: O0

us_internal_ssl_socket_context_t *
us_internal_create_child_ssl_socket_context
          (us_internal_ssl_socket_context_t *context,int context_ext_size)

{
  us_socket_context_options_t options_00;
  us_internal_ssl_socket_context_t *puVar1;
  undefined4 in_ESI;
  long in_RDI;
  undefined1 in_stack_00000000 [32];
  us_internal_ssl_socket_context_t *child_context;
  us_socket_context_options_t options;
  undefined1 local_40 [12];
  int in_stack_ffffffffffffffcc;
  us_loop_t *in_stack_ffffffffffffffd0;
  int in_stack_ffffffffffffffdc;
  undefined4 in_stack_fffffffffffffff0;
  
  memset(local_40,0,0x30);
  options_00.key_file_name._4_4_ = in_ESI;
  options_00.key_file_name._0_4_ = in_stack_fffffffffffffff0;
  options_00.cert_file_name = (char *)in_RDI;
  options_00._16_32_ = in_stack_00000000;
  puVar1 = (us_internal_ssl_socket_context_t *)
           us_create_socket_context
                     (in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd0,in_stack_ffffffffffffffcc,
                      options_00);
  puVar1->ssl_context = *(SSL_CTX **)(in_RDI + 0x90);
  puVar1->is_parent = 0;
  return puVar1;
}

Assistant:

struct us_internal_ssl_socket_context_t *us_internal_create_child_ssl_socket_context(struct us_internal_ssl_socket_context_t *context, int context_ext_size) {
    struct us_socket_context_options_t options = {0};

    struct us_internal_ssl_socket_context_t *child_context = (struct us_internal_ssl_socket_context_t *) us_create_socket_context(0, context->sc.loop, sizeof(struct us_internal_ssl_socket_context_t) + context_ext_size, options);

    // I think this is the only thing being shared
    child_context->ssl_context = context->ssl_context;
    child_context->is_parent = 0;

    return child_context;
}